

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnvironmentType.cpp
# Opt level: O3

void __thiscall
KDIS::DATA_TYPE::EnvironmentType::EnvironmentType
          (EnvironmentType *this,EntityDomain Domain,KUINT16 Class,KUINT8 Categoy,
          EnvironmentSubcategory SubCategory,KUINT8 Specific,KUINT8 Extra)

{
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase = (_func_int **)&PTR__EnvironmentType_002245a8;
  this->m_ui8EntityKind = '\x04';
  this->m_ui8Domain = (KUINT8)Domain;
  this->m_ui16Class = Class;
  this->m_ui8Category = Categoy;
  this->m_ui8SubCategory = (KUINT8)SubCategory;
  this->m_ui8Specific = Specific;
  this->m_ui8Extra = Extra;
  return;
}

Assistant:

EnvironmentType::EnvironmentType( EntityDomain Domain, KUINT16 Class, KUINT8  Categoy,
                                  EnvironmentSubcategory SubCategory, KUINT8 Specific, KUINT8 Extra ) :
    m_ui8EntityKind( Environmental ),
    m_ui8Domain( Domain ),
    m_ui16Class( Class ),
    m_ui8Category( Categoy ),
    m_ui8SubCategory( SubCategory ),
    m_ui8Specific( Specific ),
    m_ui8Extra( Extra )
{
}